

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_cache.hpp
# Opt level: O3

shared_ptr<duckdb::ParquetKeys,_true> __thiscall
duckdb::ObjectCache::Get<duckdb::ParquetKeys>(ObjectCache *this,string *key)

{
  bool bVar1;
  ObjectCacheEntry *pOVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  shared_ptr<duckdb::ObjectCacheEntry,_true> sVar4;
  shared_ptr<duckdb::ParquetKeys,_true> sVar5;
  shared_ptr<duckdb::ObjectCacheEntry,_true> object;
  undefined1 local_78 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  long *local_58;
  size_t local_50;
  long local_48 [4];
  undefined8 local_28 [2];
  
  sVar4 = GetObject((ObjectCache *)local_78,key);
  _Var3._M_pi = sVar4.internal.
                super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
  if ((_Hash_node_base *)local_78._0_8_ != (_Hash_node_base *)0x0) {
    pOVar2 = shared_ptr<duckdb::ObjectCacheEntry,_true>::operator->
                       ((shared_ptr<duckdb::ObjectCacheEntry,_true> *)local_78);
    (*pOVar2->_vptr_ObjectCacheEntry[2])(&local_58,pOVar2);
    local_48[2] = (long)local_28;
    local_28[0] = (__pthread_internal_list *)0x5f74657571726170;
    local_28[1]._0_4_ = 0x7379656b;
    local_48[3] = 0xc;
    local_28[1]._4_1_ = '\0';
    bVar1 = true;
    if (local_50 == 0xc) {
      bVar1 = (int)local_58[1] != 0x7379656b || *local_58 != 0x5f74657571726170;
    }
    _Var3._M_pi = extraout_RDX;
    if (local_58 != local_48) {
      operator_delete(local_58);
      _Var3._M_pi = extraout_RDX_00;
    }
    if (!bVar1) {
      local_78._16_8_ = local_78._0_8_;
      local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
        }
      }
      sVar5 = shared_ptr_cast<duckdb::ObjectCacheEntry,duckdb::ParquetKeys>
                        ((duckdb *)this,
                         (shared_ptr<duckdb::ObjectCacheEntry,_true> *)(local_78 + 0x10));
      _Var3._M_pi = sVar5.internal.
                    super___shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
        _Var3._M_pi = extraout_RDX_01;
      }
      goto LAB_010f0aca;
    }
  }
  (this->cache)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->cache)._M_h._M_bucket_count = 0;
LAB_010f0aca:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    _Var3._M_pi = extraout_RDX_02;
  }
  sVar5.internal.super___shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  sVar5.internal.super___shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::ParquetKeys,_true>)
         sVar5.internal.super___shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<T> Get(const string &key) {
		shared_ptr<ObjectCacheEntry> object = GetObject(key);
		if (!object || object->GetObjectType() != T::ObjectType()) {
			return nullptr;
		}
		return shared_ptr_cast<ObjectCacheEntry, T>(object);
	}